

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

bool __thiscall cfd::core::Extkey::HasMainnetKey(Extkey *this)

{
  bool bVar1;
  KeyFormatData local_88;
  Extkey *local_10;
  Extkey *this_local;
  
  local_10 = this;
  GetKeyFormatFromVersion(&local_88,this->version_);
  bVar1 = KeyFormatData::IsMainnet(&local_88);
  KeyFormatData::~KeyFormatData(&local_88);
  return bVar1;
}

Assistant:

bool Extkey::HasMainnetKey() const {
  return GetKeyFormatFromVersion(version_).IsMainnet();
}